

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preview.c
# Opt level: O2

exr_result_t exr_attr_preview_destroy(exr_context_t ctxt,exr_attr_preview_t *p)

{
  exr_result_t eVar1;
  
  if (ctxt == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    eVar1 = 0;
    if (p != (exr_attr_preview_t *)0x0) {
      if ((p->rgba != (uint8_t *)0x0) && (p->alloc_size != 0)) {
        (**(code **)(ctxt + 0x60))();
      }
      p->width = 0;
      p->height = 0;
      p->alloc_size = 0;
      p->rgba = (uint8_t *)0x0;
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_preview_destroy (exr_context_t ctxt, exr_attr_preview_t* p)
{
    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (p)
    {
        exr_attr_preview_t nil = {0};
        if (p->rgba && p->alloc_size > 0)
            pctxt->free_fn (EXR_CONST_CAST (uint8_t*, p->rgba));
        *p = nil;
    }
    return EXR_ERR_SUCCESS;
}